

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

size_t __thiscall ExportDirWrapper::mapNames(ExportDirWrapper *this)

{
  uint uVar1;
  Executable *pEVar2;
  int iVar3;
  IMAGE_EXPORT_DIRECTORY *pIVar4;
  undefined4 extraout_var;
  mapped_type_conflict *pmVar5;
  WORD *nameOrd;
  size_t i;
  offset_t nameOrdRVA;
  size_t maxNames;
  IMAGE_EXPORT_DIRECTORY *exp;
  ExportDirWrapper *this_local;
  
  pIVar4 = exportDir(this);
  if (pIVar4 == (IMAGE_EXPORT_DIRECTORY *)0x0) {
    this_local = (ExportDirWrapper *)0x0;
  }
  else {
    uVar1 = pIVar4->NumberOfNames;
    i = (size_t)pIVar4->AddressOfNameOrdinals;
    for (nameOrd = (WORD *)0x0; nameOrd < (WORD *)(ulong)uVar1;
        nameOrd = (WORD *)((long)nameOrd + 1)) {
      pEVar2 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar2,i,2,2,0);
      if ((key_type_conflict1 *)CONCAT44(extraout_var,iVar3) == (key_type_conflict1 *)0x0) break;
      pmVar5 = std::
               map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
               ::operator[](&this->ordToNameId,(key_type_conflict1 *)CONCAT44(extraout_var,iVar3));
      *pmVar5 = (mapped_type_conflict)nameOrd;
      i = i + 2;
    }
    this_local = (ExportDirWrapper *)nameOrd;
  }
  return (size_t)this_local;
}

Assistant:

size_t ExportDirWrapper::mapNames()
{
    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxNames = exp->NumberOfNames;

    offset_t nameOrdRVA = exp->AddressOfNameOrdinals;
    //uint64_t nameRVA = exp->AddressOfNames;
    size_t i = 0;
    for (i = 0; i < maxNames; i++) {

        WORD* nameOrd = (WORD*) this->m_Exe->getContentAt(nameOrdRVA, Executable::RVA, sizeof(WORD));
        //DWORD* name = (DWORD*) this->m_Exe->getContentAt(nameRVA, Executable::RVA, sizeof(DWORD));
        if (nameOrd == NULL) break;

        this->ordToNameId[*nameOrd] = i;//*name;

        nameOrdRVA += sizeof(WORD);
        //nameRVA += sizeof(DWORD);
    }
    return i;
}